

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O3

void __thiscall
MDIOAnalyzerResults::GenC22DataString
          (MDIOAnalyzerResults *this,Frame *frame,DisplayBase display_base,bool tabular)

{
  undefined7 in_register_00000009;
  char number_str [128];
  char local_98 [128];
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,0x10,local_98,0x80);
  if ((int)CONCAT71(in_register_00000009,tabular) == 0) {
    AnalyzerResults::AddResultString
              ((char *)this,"D",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"D[",local_98,"]",(char *)0x0,(char *)0x0);
  }
  AnalyzerResults::AddResultString((char *)this,"Data [",local_98,"]",(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenC22DataString( const Frame& frame, DisplayBase display_base, bool tabular )
{
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );

    if( !tabular )
    {
        AddResultString( "D" );
        AddResultString( "D[", number_str, "]" );
    }
    AddResultString( "Data [", number_str, "]" );
}